

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

void __thiscall
kj::
ArrayBuilder<kj::HashMap<unsigned_long,_capnp::_::(anonymous_namespace)::TestVat::ThirdPartyExchange>::Entry>
::dispose(ArrayBuilder<kj::HashMap<unsigned_long,_capnp::_::(anonymous_namespace)::TestVat::ThirdPartyExchange>::Entry>
          *this)

{
  Entry *firstElement;
  RemoveConst<kj::HashMap<unsigned_long,_capnp::_::(anonymous_namespace)::TestVat::ThirdPartyExchange>::Entry>
  *pRVar1;
  Entry *pEVar2;
  Entry *endCopy;
  Entry *posCopy;
  Entry *ptrCopy;
  ArrayBuilder<kj::HashMap<unsigned_long,_capnp::_::(anonymous_namespace)::TestVat::ThirdPartyExchange>::Entry>
  *this_local;
  
  firstElement = this->ptr;
  pRVar1 = this->pos;
  pEVar2 = this->endPtr;
  if (firstElement != (Entry *)0x0) {
    this->ptr = (Entry *)0x0;
    this->pos = (RemoveConst<kj::HashMap<unsigned_long,_capnp::_::(anonymous_namespace)::TestVat::ThirdPartyExchange>::Entry>
                 *)0x0;
    this->endPtr = (Entry *)0x0;
    ArrayDisposer::
    dispose<kj::HashMap<unsigned_long,capnp::_::(anonymous_namespace)::TestVat::ThirdPartyExchange>::Entry>
              (this->disposer,firstElement,((long)pRVar1 - (long)firstElement) / 0x28,
               ((long)pEVar2 - (long)firstElement) / 0x28);
  }
  return;
}

Assistant:

inline void dispose() {
    // Make sure that if an exception is thrown, we are left with a null ptr, so we won't possibly
    // dispose again.
    T* ptrCopy = ptr;
    T* posCopy = pos;
    T* endCopy = endPtr;
    if (ptrCopy != nullptr) {
      ptr = nullptr;
      pos = nullptr;
      endPtr = nullptr;
      disposer->dispose(ptrCopy, posCopy - ptrCopy, endCopy - ptrCopy);
    }
  }